

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O0

MPP_RET os_allocator_dma_heap_open(void **ctx,size_t alignment,MppAllocFlagType flags)

{
  undefined4 *puVar1;
  RK_U32 type;
  DmaHeapInfo *info;
  allocator_ctx_dmaheap *p;
  MppAllocFlagType flags_local;
  size_t alignment_local;
  void **ctx_local;
  
  mpp_env_get_u32("dma_heap_debug",&dma_heap_debug,dma_heap_debug);
  if (ctx == (void **)0x0) {
    _mpp_log_l(2,"mpp_dma_heap","does not accept NULL input\n","os_allocator_dma_heap_open");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (void *)0x0;
    if (heap_infos[flags].fd < 1) {
      _mpp_log_l(2,"mpp_dma_heap","open dma heap type %x %s failed!\n","os_allocator_dma_heap_open",
                 0,heap_infos[flags].name);
      ctx_local._4_4_ = MPP_ERR_UNKNOW;
    }
    else {
      puVar1 = (undefined4 *)mpp_osal_malloc("os_allocator_dma_heap_open",0xc);
      if (puVar1 == (undefined4 *)0x0) {
        _mpp_log_l(2,"mpp_dma_heap","failed to allocate context\n","os_allocator_dma_heap_open");
        ctx_local._4_4_ = MPP_ERR_MALLOC;
      }
      else {
        *puVar1 = (int)alignment;
        puVar1[2] = heap_infos[flags].flags;
        puVar1[1] = heap_infos[flags].fd;
        *ctx = puVar1;
        if ((dma_heap_debug & 1) != 0) {
          _mpp_log_l(4,"mpp_dma_heap","dev %d open heap type %x:%x\n",(char *)0x0,
                     (ulong)(uint)puVar1[1],(ulong)flags,heap_infos[flags].flags);
        }
        ctx_local._4_4_ = MPP_OK;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET os_allocator_dma_heap_open(void **ctx, size_t alignment, MppAllocFlagType flags)
{
    allocator_ctx_dmaheap *p;
    DmaHeapInfo *info = NULL;
    RK_U32 type = 0;

    mpp_env_get_u32("dma_heap_debug", &dma_heap_debug, dma_heap_debug);

    if (NULL == ctx) {
        mpp_err_f("does not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;

    info = &heap_infos[flags];
    if (info->fd <= 0) {
        mpp_err_f("open dma heap type %x %s failed!\n", type, info->name);
        return MPP_ERR_UNKNOW;
    }

    p = mpp_malloc(allocator_ctx_dmaheap, 1);
    if (NULL == p) {
        mpp_err_f("failed to allocate context\n");
        return MPP_ERR_MALLOC;
    } else {
        p->alignment    = alignment;
        p->flags        = info->flags;
        p->device       = info->fd;
        *ctx = p;
    }

    dma_heap_dbg_ops("dev %d open heap type %x:%x\n", p->device, flags, info->flags);

    return MPP_OK;
}